

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O0

factor * __thiscall
merlin::factor::maxmarginal(factor *__return_storage_ptr__,factor *this,variable_set *target)

{
  double dVar1;
  variable_set *pvVar2;
  size_t sVar3;
  value *pvVar4;
  const_reference pvVar5;
  value vVar6;
  value local_100;
  ulong local_b8;
  size_t i;
  subindex s;
  variable_set local_60;
  byte local_21;
  variable_set *local_20;
  variable_set *target_local;
  factor *this_local;
  factor *F;
  
  local_21 = 0;
  local_20 = target;
  target_local = (variable_set *)this;
  this_local = __return_storage_ptr__;
  pvVar2 = vars(this);
  variable_set::operator&(&local_60,target,pvVar2);
  vVar6 = infty();
  factor(__return_storage_ptr__,&local_60,-vVar6);
  variable_set::~variable_set(&local_60);
  pvVar2 = vars(__return_storage_ptr__);
  subindex::subindex((subindex *)&i,&this->v_,pvVar2);
  local_b8 = 0;
  while( true ) {
    sVar3 = num_states(this);
    if (sVar3 <= local_b8) break;
    sVar3 = subindex::operator_cast_to_unsigned_long((subindex *)&i);
    pvVar4 = operator[](__return_storage_ptr__,sVar3);
    dVar1 = *pvVar4;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&this->t_,local_b8);
    if (dVar1 < *pvVar5 || dVar1 == *pvVar5) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&this->t_,local_b8);
      local_100 = *pvVar5;
    }
    else {
      sVar3 = subindex::operator_cast_to_unsigned_long((subindex *)&i);
      pvVar4 = operator[](__return_storage_ptr__,sVar3);
      local_100 = *pvVar4;
    }
    sVar3 = subindex::operator_cast_to_unsigned_long((subindex *)&i);
    pvVar4 = operator[](__return_storage_ptr__,sVar3);
    *pvVar4 = local_100;
    local_b8 = local_b8 + 1;
    subindex::operator++((subindex *)&i);
  }
  local_21 = 1;
  subindex::~subindex((subindex *)&i);
  if ((local_21 & 1) == 0) {
    ~factor(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

factor maxmarginal(variable_set const& target) const {
		factor F(target & vars(), -infty());
		subindex s(v_, F.vars());
		for (size_t i = 0; i < num_states(); ++i, ++s)
			F[s] = (F[s] > t_[i]) ? F[s] : t_[i];
		return F;
	}